

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabItemBackground(ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImU32 col)

{
  ImVec2 *pIVar1;
  ImGuiContext *pIVar2;
  ImU32 col_00;
  ImVec2 *pIVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 local_70;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar2 = GImGui;
  fVar9 = (bb->Min).x;
  fVar10 = (bb->Max).x - fVar9;
  if (fVar10 <= 0.0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x1cb8,"TabItemBackground","ImGui ASSERT FAILED: %s");
    fVar9 = (bb->Min).x;
  }
  fVar8 = (pIVar2->Style).TabRounding;
  fVar10 = fVar10 * 0.5 + -1.0;
  if (fVar10 <= fVar8) {
    fVar8 = fVar10;
  }
  local_68._4_4_ = 0.0;
  local_68._0_4_ = (bb->Min).y + 1.0;
  fVar10 = (bb->Max).y + -1.0;
  local_58 = ZEXT416(~-(uint)(fVar8 <= 0.0) & (uint)fVar8);
  iVar6 = (draw_list->_Path).Size;
  if (iVar6 == (draw_list->_Path).Capacity) {
    _local_68 = ZEXT416((uint)local_68._0_4_);
    if (iVar6 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar6 / 2 + iVar6;
    }
    iVar7 = iVar6 + 1;
    if (iVar6 + 1 < iVar5) {
      iVar7 = iVar5;
    }
    pIVar3 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
    pIVar1 = (draw_list->_Path).Data;
    if (pIVar1 != (ImVec2 *)0x0) {
      memcpy(pIVar3,pIVar1,(long)(draw_list->_Path).Size << 3);
      MemFree((draw_list->_Path).Data);
    }
    (draw_list->_Path).Data = pIVar3;
    (draw_list->_Path).Capacity = iVar7;
    iVar6 = (draw_list->_Path).Size;
  }
  else {
    pIVar3 = (draw_list->_Path).Data;
  }
  pIVar3[iVar6].x = fVar9;
  pIVar3[iVar6].y = fVar10;
  (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
  fVar9 = (bb->Min).x + (float)local_58._0_4_;
  local_48 = (float)local_68._0_4_ + (float)local_58._0_4_;
  fStack_5c = (float)local_68._4_4_ + (float)local_58._0_4_;
  local_68._4_4_ = local_48;
  local_68._0_4_ = fVar9;
  fStack_60 = (float)local_58._0_4_ + 0.0;
  local_70.y = local_48;
  local_70.x = fVar9;
  fStack_44 = local_48;
  fStack_40 = local_48;
  fStack_3c = local_48;
  ImDrawList::PathArcToFast(draw_list,&local_70,(float)local_58._0_4_,6,9);
  local_70.y = local_48;
  local_70.x = (bb->Max).x - (float)local_58._0_4_;
  ImDrawList::PathArcToFast(draw_list,&local_70,(float)local_58._0_4_,9,0xc);
  fVar9 = (bb->Max).x;
  iVar6 = (draw_list->_Path).Size;
  if (iVar6 == (draw_list->_Path).Capacity) {
    if (iVar6 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar6 / 2 + iVar6;
    }
    iVar7 = iVar6 + 1;
    if (iVar6 + 1 < iVar5) {
      iVar7 = iVar5;
    }
    pIVar3 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
    pIVar1 = (draw_list->_Path).Data;
    if (pIVar1 != (ImVec2 *)0x0) {
      memcpy(pIVar3,pIVar1,(long)(draw_list->_Path).Size << 3);
      MemFree((draw_list->_Path).Data);
    }
    (draw_list->_Path).Data = pIVar3;
    (draw_list->_Path).Capacity = iVar7;
    iVar6 = (draw_list->_Path).Size;
  }
  else {
    pIVar3 = (draw_list->_Path).Data;
  }
  pIVar3[iVar6].x = fVar9;
  pIVar3[iVar6].y = fVar10;
  iVar6 = (draw_list->_Path).Size + 1;
  (draw_list->_Path).Size = iVar6;
  ImDrawList::AddConvexPolyFilled(draw_list,(draw_list->_Path).Data,iVar6,col);
  (draw_list->_Path).Size = 0;
  if (0.0 < (pIVar2->Style).TabBorderSize) {
    fVar9 = (bb->Min).x;
    if ((draw_list->_Path).Capacity == 0) {
      pIVar3 = (ImVec2 *)MemAlloc(0x40);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar3;
      (draw_list->_Path).Capacity = 8;
      lVar4 = (long)(draw_list->_Path).Size;
    }
    else {
      pIVar3 = (draw_list->_Path).Data;
      lVar4 = 0;
    }
    pIVar3[lVar4].x = fVar9 + 0.5;
    pIVar3[lVar4].y = fVar10;
    (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
    local_68._0_4_ = (bb->Min).x + (float)local_58._0_4_ + 0.5;
    local_68._4_4_ = (float)local_68._4_4_ + 0.5;
    fStack_60 = fStack_60 + 0.0;
    fStack_5c = fStack_5c + 0.0;
    local_70.y = (float)local_68._4_4_;
    local_70.x = (float)local_68._0_4_;
    ImDrawList::PathArcToFast(draw_list,&local_70,(float)local_58._0_4_,6,9);
    local_70.y = (float)local_68._4_4_;
    local_70.x = ((bb->Max).x - (float)local_58._0_4_) + -0.5;
    ImDrawList::PathArcToFast(draw_list,&local_70,(float)local_58._0_4_,9,0xc);
    fVar9 = (bb->Max).x;
    iVar6 = (draw_list->_Path).Size;
    if (iVar6 == (draw_list->_Path).Capacity) {
      if (iVar6 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar6 / 2 + iVar6;
      }
      iVar7 = iVar6 + 1;
      if (iVar6 + 1 < iVar5) {
        iVar7 = iVar5;
      }
      pIVar3 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar3;
      (draw_list->_Path).Capacity = iVar7;
      iVar6 = (draw_list->_Path).Size;
    }
    else {
      pIVar3 = (draw_list->_Path).Data;
    }
    pIVar3[iVar6].x = fVar9 + -0.5;
    pIVar3[iVar6].y = fVar10;
    (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
    col_00 = GetColorU32(5,1.0);
    ImDrawList::AddPolyline
              (draw_list,(draw_list->_Path).Data,(draw_list->_Path).Size,col_00,false,
               (pIVar2->Style).TabBorderSize);
    (draw_list->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImGui::TabItemBackground(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImU32 col)
{
    // While rendering tabs, we trim 1 pixel off the top of our bounding box so they can fit within a regular frame height while looking "detached" from it.
    ImGuiContext& g = *GImGui;
    const float width = bb.GetWidth();
    IM_UNUSED(flags);
    IM_ASSERT(width > 0.0f);
    const float rounding = ImMax(0.0f, ImMin(g.Style.TabRounding, width * 0.5f - 1.0f));
    const float y1 = bb.Min.y + 1.0f;
    const float y2 = bb.Max.y - 1.0f;
    draw_list->PathLineTo(ImVec2(bb.Min.x, y2));
    draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding, y1 + rounding), rounding, 6, 9);
    draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding, y1 + rounding), rounding, 9, 12);
    draw_list->PathLineTo(ImVec2(bb.Max.x, y2));
    draw_list->PathFillConvex(col);
    if (g.Style.TabBorderSize > 0.0f)
    {
        draw_list->PathLineTo(ImVec2(bb.Min.x + 0.5f, y2));
        draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding + 0.5f, y1 + rounding + 0.5f), rounding, 6, 9);
        draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding - 0.5f, y1 + rounding + 0.5f), rounding, 9, 12);
        draw_list->PathLineTo(ImVec2(bb.Max.x - 0.5f, y2));
        draw_list->PathStroke(GetColorU32(ImGuiCol_Border), false, g.Style.TabBorderSize);
    }
}